

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O1

void __thiscall FTextureManager::WriteTexture(FTextureManager *this,FArchive *arc,int picnum)

{
  FTexture *pFVar1;
  ulong uVar2;
  FTexture *pFVar3;
  char *name;
  
  if (-1 < picnum) {
    uVar2 = 0;
    if ((uint)picnum < (this->Textures).Count) {
      uVar2 = (ulong)(uint)picnum;
    }
    pFVar1 = (this->Textures).Array[uVar2].Texture;
    pFVar3 = FWadCollection::GetLinkedTexture(&Wads,pFVar1->SourceLump);
    if (pFVar3 == pFVar1) {
      name = FWadCollection::GetLumpFullName(&Wads,pFVar1->SourceLump);
    }
    else {
      name = (pFVar1->Name).Chars;
    }
    FArchive::WriteName(arc,name);
    FArchive::WriteCount(arc,(uint)pFVar1->UseType);
    return;
  }
  FArchive::WriteName(arc,(char *)0x0);
  return;
}

Assistant:

void FTextureManager::WriteTexture (FArchive &arc, int picnum)
{
	FTexture *pic;

	if (picnum < 0)
	{
		arc.WriteName(NULL);
		return;
	}
	else if ((size_t)picnum >= Textures.Size())
	{
		pic = Textures[0].Texture;
	}
	else
	{
		pic = Textures[picnum].Texture;
	}

	if (Wads.GetLinkedTexture(pic->SourceLump) == pic)
	{
		arc.WriteName(Wads.GetLumpFullName(pic->SourceLump));
	}
	else
	{
		arc.WriteName(pic->Name);
	}
	arc.WriteCount(pic->UseType);
}